

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDPrivateKey.cpp
# Opt level: O2

ByteString * __thiscall
EDPrivateKey::serialise(ByteString *__return_storage_ptr__,EDPrivateKey *this)

{
  ByteString local_60;
  ByteString local_38;
  
  ByteString::serialise(&local_38,&this->ec);
  ByteString::serialise(&local_60,&this->k);
  operator+(__return_storage_ptr__,&local_38,&local_60);
  ByteString::~ByteString(&local_60);
  ByteString::~ByteString(&local_38);
  return __return_storage_ptr__;
}

Assistant:

ByteString EDPrivateKey::serialise() const
{
	return ec.serialise() +
	       k.serialise();
}